

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::GetWorldToScreenScale(ON_Viewport *this,ON_3dPoint world_point,double *scale)

{
  bool bVar1;
  double *CameraLocation;
  double *CameraZ;
  double dVar2;
  ON_3dVector OStack_68;
  ON_3dPoint local_50;
  ON_3dVector local_38;
  
  if (scale != (double *)0x0) {
    *scale = 0.0;
  }
  dVar2 = -1.23432101234321e+308;
  if (this->m_projection == perspective_view) {
    bVar1 = ON_3dPoint::IsValid(&world_point);
    dVar2 = -1.23432101234321e+308;
    if (bVar1) {
      CameraLocation = ON_3dPoint::operator_cast_to_double_(&local_50);
      CameraZ = ON_3dVector::operator_cast_to_double_(&OStack_68);
      bVar1 = GetCameraFrame(this,CameraLocation,(double *)0x0,(double *)0x0,CameraZ);
      if ((!bVar1) || (this->m_frus_near <= 0.0)) {
        return false;
      }
      ON_3dPoint::operator-(&local_38,&local_50,&world_point);
      dVar2 = ON_3dVector::operator*(&OStack_68,&local_38);
      dVar2 = (double)(~-(ulong)(0.0 < dVar2) & 0xffe5f8bd9e331dd2 |
                      (ulong)dVar2 & -(ulong)(0.0 < dVar2));
    }
  }
  bVar1 = GetWorldToScreenScale(this,dVar2,scale);
  return bVar1;
}

Assistant:

bool ON_Viewport::GetWorldToScreenScale(
  ON_3dPoint world_point,
  double* scale
  ) const
{
  double frustum_depth = ON_UNSET_VALUE;

  if (nullptr != scale)
    *scale = 0.0;

  if (IsPerspectiveProjection() && world_point.IsValid())
  {
    ON_3dPoint CamLoc;
    ON_3dVector CamZ;
    if (!GetCameraFrame(CamLoc, nullptr, nullptr, CamZ) || !(m_frus_near > 0.0))
      return false;
    frustum_depth = CamZ*(CamLoc - world_point);
    if (!(frustum_depth > 0.0))
      frustum_depth = ON_UNSET_VALUE;
  }

  return GetWorldToScreenScale(frustum_depth, scale);
}